

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrEnumerateEnvironmentDepthSwapchainImagesMETA
                   (XrEnvironmentDepthSwapchainMETA swapchain,uint32_t imageCapacityInput,
                   uint32_t *imageCountOutput,XrSwapchainImageBaseHeader *images)

{
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar1;
  ValidateXrHandleResult VVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  allocator local_561;
  string local_560 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_540;
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_4b0;
  allocator local_491;
  string local_490 [39];
  allocator local_469;
  string local_468 [32];
  __cxx11 local_448 [39];
  allocator local_421;
  string local_420 [8];
  string error_message;
  allocator local_3f9;
  string local_3f8 [32];
  XrSwapchainImageBaseHeader *local_3d8;
  XrSwapchainImageOpenGLKHR *new_swapchainimageopenglkhr_value;
  uint32_t value_images_inc;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3a8;
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_318;
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  GenValidUsageXrInstanceInfo *local_2b0;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_environmentdepthswapchainmeta_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_288 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_268;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  XrEnvironmentDepthSwapchainMETA_T local_200 [32];
  ostringstream local_1e0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_54;
  undefined1 local_50 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrSwapchainImageBaseHeader *images_local;
  uint32_t *imageCountOutput_local;
  XrEnvironmentDepthSwapchainMETA pXStack_18;
  uint32_t imageCapacityInput_local;
  XrEnvironmentDepthSwapchainMETA swapchain_local;
  GenValidUsageXrInstanceInfo *pGVar3;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  pXStack_18 = swapchain;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  local_54 = XR_OBJECT_TYPE_ENVIRONMENT_DEPTH_SWAPCHAIN_META;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrEnvironmentDepthSwapchainMETA_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_50
             ,&stack0xffffffffffffffe8,&local_54);
  VVar2 = VerifyXrEnvironmentDepthSwapchainMETAHandle(&stack0xffffffffffffffe8);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar4 = HandleInfo<XrEnvironmentDepthSwapchainMETA_T_*>::getWithInstanceInfo
                      (&g_environmentdepthswapchainmeta_info,pXStack_18);
    pGVar3 = pVar4.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar4.first;
    local_2b0 = pGVar3;
    gen_environmentdepthswapchainmeta_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar3;
    if ((imageCapacityInput == 0) || (images != (XrSwapchainImageBaseHeader *)0x0)) {
      if (imageCountOutput == (uint32_t *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_360,
                   "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-imageCountOutput-parameter",
                   &local_361);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_388,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",&local_389);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3a8,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&value_images_inc,
                   "Invalid NULL for uint32_t \"imageCountOutput\" which is not optional and must be non-NULL"
                   ,(allocator *)((long)&new_swapchainimageopenglkhr_value + 7));
        CoreValidLogMessage(pGVar3,(string *)local_360,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_388,&local_3a8,(string *)&value_images_inc);
        std::__cxx11::string::~string((string *)&value_images_inc);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&new_swapchainimageopenglkhr_value + 7));
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3a8);
        std::__cxx11::string::~string(local_388);
        std::allocator<char>::~allocator((allocator<char> *)&local_389);
        std::__cxx11::string::~string(local_360);
        std::allocator<char>::~allocator((allocator<char> *)&local_361);
        pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
        pVar1.first = gen_environmentdepthswapchainmeta_info;
        pVar4.second = local_2b0;
        pVar4.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
        swapchain_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        info_with_instance.second._4_4_ = 1;
      }
      else {
        pVar1 = pVar4;
        if (images != (XrSwapchainImageBaseHeader *)0x0) {
          new_swapchainimageopenglkhr_value._0_4_ = 0;
          while( true ) {
            info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar1.second;
            gen_environmentdepthswapchainmeta_info = pVar1.first;
            local_2b0 = pVar4.second;
            pGVar3 = local_2b0;
            gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar4.first;
            if (imageCapacityInput <= (uint)new_swapchainimageopenglkhr_value) break;
            if (((images == (XrSwapchainImageBaseHeader *)0x0) ||
                (local_3d8 = images,
                *(int *)((long)images + (ulong)(uint)new_swapchainimageopenglkhr_value * 0x18) !=
                0x3b9b23dc)) || (images == (XrSwapchainImageBaseHeader *)0x0)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_4d0,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",&local_4d1);
              objects_info.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   ValidateXrStruct(pGVar3,(string *)local_4d0,
                                    (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                     *)local_50,true,true,
                                    images + (uint)new_swapchainimageopenglkhr_value);
              std::__cxx11::string::~string(local_4d0);
              std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
              pGVar3 = local_2b0;
              if (objects_info.
                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_4f8,
                           "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                           &local_4f9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_520,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",&local_521);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_540,
                       (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        *)local_50);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_560,
                           "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images is invalid"
                           ,&local_561);
                CoreValidLogMessage(pGVar3,(string *)local_4f8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                    (string *)local_520,&local_540,(string *)local_560);
                std::__cxx11::string::~string(local_560);
                std::allocator<char>::~allocator((allocator<char> *)&local_561);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                ~vector(&local_540);
                std::__cxx11::string::~string(local_520);
                std::allocator<char>::~allocator((allocator<char> *)&local_521);
                std::__cxx11::string::~string(local_4f8);
                std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
                pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
                pVar1.first = gen_environmentdepthswapchainmeta_info;
                pVar4.second = local_2b0;
                pVar4.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
                swapchain_local._4_4_ =
                     objects_info.
                     super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                info_with_instance.second._4_4_ = 1;
                goto LAB_00315873;
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_3f8,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",&local_3f9);
              objects_info.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   ValidateXrStruct(pGVar3,(string *)local_3f8,
                                    (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                     *)local_50,false,true,
                                    (XrSwapchainImageOpenGLKHR *)
                                    ((long)local_3d8 +
                                    (ulong)(uint)new_swapchainimageopenglkhr_value * 0x18));
              std::__cxx11::string::~string(local_3f8);
              std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
              if (objects_info.
                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_420,
                           "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images",
                           &local_421);
                std::allocator<char>::~allocator((allocator<char> *)&local_421);
                std::__cxx11::string::operator+=(local_420,"[");
                std::__cxx11::to_string(local_448,(uint)new_swapchainimageopenglkhr_value);
                std::__cxx11::string::operator+=(local_420,(string *)local_448);
                std::__cxx11::string::~string((string *)local_448);
                std::__cxx11::string::operator+=(local_420,"]");
                std::__cxx11::string::operator+=(local_420," is invalid");
                pGVar3 = local_2b0;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_468,
                           "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                           &local_469);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_490,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",&local_491);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_4b0,
                       (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        *)local_50);
                CoreValidLogMessage(pGVar3,(string *)local_468,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                    (string *)local_490,&local_4b0,(string *)local_420);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                ~vector(&local_4b0);
                std::__cxx11::string::~string(local_490);
                std::allocator<char>::~allocator((allocator<char> *)&local_491);
                std::__cxx11::string::~string(local_468);
                std::allocator<char>::~allocator((allocator<char> *)&local_469);
                swapchain_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
                info_with_instance.second._4_4_ = 1;
                std::__cxx11::string::~string(local_420);
                pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
                pVar1.first = gen_environmentdepthswapchainmeta_info;
                pVar4.second = local_2b0;
                pVar4.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
                goto LAB_00315873;
              }
            }
            pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
            pVar1.first = gen_environmentdepthswapchainmeta_info;
            pVar4.second = local_2b0;
            pVar4.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
            new_swapchainimageopenglkhr_value._0_4_ = (uint)new_swapchainimageopenglkhr_value + 1;
          }
        }
        swapchain_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2d0,"VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                 &local_2d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2f8,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",&local_2f9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_318,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_338,
                 "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images is NULL, but imageCapacityInput is greater than 0"
                 ,&local_339);
      CoreValidLogMessage(pGVar3,(string *)local_2d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2f8,&local_318,(string *)local_338);
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_318);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
      pVar1.first = gen_environmentdepthswapchainmeta_info;
      pVar4.second = local_2b0;
      pVar4.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
      swapchain_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    std::operator<<((ostream *)local_1e0,
                    "Invalid XrEnvironmentDepthSwapchainMETA handle \"swapchain\" ");
    HandleToHexString<XrEnvironmentDepthSwapchainMETA_T*>(local_200);
    std::operator<<((ostream *)local_1e0,(string *)local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_220,"VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-swapchain-parameter",
               &local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_248,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",&local_249);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_268,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_50);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_220,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_248,&local_268,local_288);
    std::__cxx11::string::~string((string *)local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_268);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    swapchain_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
    pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
    pVar1.first = gen_environmentdepthswapchainmeta_info;
    pVar4.second = local_2b0;
    pVar4.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
  }
LAB_00315873:
  info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar1.second;
  gen_environmentdepthswapchainmeta_info = pVar1.first;
  local_2b0 = pVar4.second;
  gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar4.first;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  return swapchain_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrEnumerateEnvironmentDepthSwapchainImagesMETA(
XrEnvironmentDepthSwapchainMETA swapchain,
uint32_t imageCapacityInput,
uint32_t* imageCountOutput,
XrSwapchainImageBaseHeader* images) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(swapchain, XR_OBJECT_TYPE_ENVIRONMENT_DEPTH_SWAPCHAIN_META);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrEnvironmentDepthSwapchainMETAHandle(&swapchain);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrEnvironmentDepthSwapchainMETA handle \"swapchain\" ";
                oss << HandleToHexString(swapchain);
                CoreValidLogMessage(nullptr, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-swapchain-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_environmentdepthswapchainmeta_info.getWithInstanceInfo(swapchain);
        GenValidUsageXrHandleInfo *gen_environmentdepthswapchainmeta_info = info_with_instance.first;
        (void)gen_environmentdepthswapchainmeta_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Optional array must be non-NULL when imageCapacityInput is non-zero
        if (0 != imageCapacityInput && nullptr == images) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                objects_info,
                                "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images is NULL, but imageCapacityInput is greater than 0");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == imageCountOutput) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-imageCountOutput-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA", objects_info,
                                "Invalid NULL for uint32_t \"imageCountOutput\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-imageCountOutput-parameter" type
        if (images) {
            for (uint32_t value_images_inc = 0; value_images_inc < imageCapacityInput; ++value_images_inc) {
#if defined(XR_USE_GRAPHICS_API_OPENGL)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageOpenGLKHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageOpenGLKHR* new_swapchainimageopenglkhr_value = reinterpret_cast<XrSwapchainImageOpenGLKHR*>(images);
                        if (new_swapchainimageopenglkhr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_OPENGL_KHR) {
                            if (nullptr != new_swapchainimageopenglkhr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimageopenglkhr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_OPENGL)
#if defined(XR_USE_GRAPHICS_API_OPENGL_ES)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageOpenGLESKHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageOpenGLESKHR* new_swapchainimageopengleskhr_value = reinterpret_cast<XrSwapchainImageOpenGLESKHR*>(images);
                        if (new_swapchainimageopengleskhr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_OPENGL_ES_KHR) {
                            if (nullptr != new_swapchainimageopengleskhr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimageopengleskhr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_OPENGL_ES)
#if defined(XR_USE_GRAPHICS_API_VULKAN)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageVulkanKHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageVulkanKHR* new_swapchainimagevulkankhr_value = reinterpret_cast<XrSwapchainImageVulkanKHR*>(images);
                        if (new_swapchainimagevulkankhr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_VULKAN_KHR) {
                            if (nullptr != new_swapchainimagevulkankhr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimagevulkankhr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_VULKAN)
#if defined(XR_USE_GRAPHICS_API_D3D11)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageD3D11KHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageD3D11KHR* new_swapchainimaged3d11khr_value = reinterpret_cast<XrSwapchainImageD3D11KHR*>(images);
                        if (new_swapchainimaged3d11khr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_D3D11_KHR) {
                            if (nullptr != new_swapchainimaged3d11khr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimaged3d11khr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_D3D11)
#if defined(XR_USE_GRAPHICS_API_D3D12)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageD3D12KHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageD3D12KHR* new_swapchainimaged3d12khr_value = reinterpret_cast<XrSwapchainImageD3D12KHR*>(images);
                        if (new_swapchainimaged3d12khr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_D3D12_KHR) {
                            if (nullptr != new_swapchainimaged3d12khr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimaged3d12khr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_D3D12)
                // Validate that the base-structure XrSwapchainImageBaseHeader is valid
                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA", objects_info,
                                                                true, true, &images[value_images_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                        objects_info,
                                        "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images is invalid");
                    return xr_result;
                }
            }
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}